

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::UpdateWindowManualResize
               (ImGuiWindow *window,ImVec2 *size_auto_fit,int *border_held,int resize_grip_count,
               ImU32 *resize_grip_col,ImRect *visibility_rect)

{
  ImVec2 mx;
  ImVec2 new_size;
  ImVec2 new_size_00;
  ImU32 IVar1;
  float in_ECX;
  ImGuiMouseCursor IVar2;
  uint *in_RDX;
  undefined8 *in_RSI;
  ImGuiWindow *in_RDI;
  ImU32 *in_R8;
  float *in_R9;
  float fVar3;
  float fVar4;
  ImVec2 IVar5;
  ImRect IVar6;
  float NAV_RESIZE_SPEED;
  ImVec2 nav_resize_delta;
  ImVec2 clamp_max_1;
  ImVec2 clamp_min_1;
  ImVec2 border_posn;
  ImVec2 border_target;
  ImRect border_rect;
  bool held_1;
  bool hovered_1;
  int border_n;
  ImVec2 clamp_max;
  ImVec2 clamp_min;
  ImVec2 corner_target;
  bool held;
  bool hovered;
  ImRect resize_rect;
  ImVec2 corner;
  ImGuiResizeGripDef *grip;
  int resize_grip_n;
  ImVec2 size_target;
  ImVec2 pos_target;
  float grip_hover_outer_size;
  float grip_hover_inner_size;
  float grip_draw_size;
  int resize_border_count;
  bool ret_auto_fit;
  ImGuiWindowFlags flags;
  ImGuiContext *g;
  undefined4 in_stack_fffffffffffffdc8;
  float in_stack_fffffffffffffdcc;
  ImGuiWindow *in_stack_fffffffffffffdd0;
  ImVec2 *lhs;
  ImVec2 *in_stack_fffffffffffffdd8;
  float in_stack_fffffffffffffde0;
  float in_stack_fffffffffffffde4;
  float in_stack_fffffffffffffde8;
  float in_stack_fffffffffffffdec;
  float in_stack_fffffffffffffdf0;
  float in_stack_fffffffffffffdf4;
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  float in_stack_fffffffffffffe00;
  float in_stack_fffffffffffffe04;
  float in_stack_fffffffffffffe08;
  float in_stack_fffffffffffffe0c;
  float in_stack_fffffffffffffe10;
  float in_stack_fffffffffffffe14;
  ImVec2 *in_stack_fffffffffffffe18;
  ImGuiWindow *in_stack_fffffffffffffe20;
  float in_stack_fffffffffffffe28;
  float local_1d0;
  ImVec2 local_188;
  ImVec2 local_180;
  ImVec2 local_178;
  ImVec2 local_170;
  ImVec2 local_168;
  ImVec2 local_160;
  ImVec2 local_158;
  ImVec2 local_150;
  ImVec2 local_148;
  ImVec2 local_140;
  ImVec2 local_138;
  ImVec2 local_130;
  ImVec2 local_128;
  byte local_11e;
  byte local_11d;
  uint local_11c;
  ImVec2 local_118;
  ImVec2 local_110;
  ImVec2 local_108;
  ImVec2 local_100;
  ImVec2 local_f8;
  ImVec2 local_f0;
  ImVec2 local_e8;
  ImVec2 local_e0;
  ImVec2 local_d8;
  undefined8 local_d0;
  ImVec2 local_c4;
  byte local_ba;
  byte local_b9;
  ImVec2 local_b8;
  ImVec2 local_b0;
  ImVec2 local_a8;
  ImVec2 local_a0;
  ImRect local_98;
  ImVec2 local_88;
  undefined1 local_80 [20];
  float local_6c;
  ImVec2 local_68;
  ImVec2 local_60;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  byte local_45;
  float local_44;
  ImGuiContext *local_40;
  float *local_38;
  ImU32 *local_30;
  float local_24;
  uint *local_20;
  undefined8 *local_18;
  ImGuiWindow *local_10;
  
  local_40 = GImGui;
  local_44 = (float)in_RDI->Flags;
  if ((((((uint)local_44 & 2) != 0) || (((uint)local_44 & 0x40) != 0)) ||
      ('\0' < in_RDI->AutoFitFramesX)) || ('\0' < in_RDI->AutoFitFramesY)) {
    return false;
  }
  if ((in_RDI->WasActive & 1U) == 0) {
    return false;
  }
  local_45 = 0;
  local_4c = 0.0;
  if (((GImGui->IO).ConfigWindowsResizeFromEdges & 1U) != 0) {
    local_4c = 5.60519e-45;
  }
  local_38 = in_R9;
  local_30 = in_R8;
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  fVar3 = ImMax<float>(GImGui->FontSize * 1.35,GImGui->FontSize * 0.2 + in_RDI->WindowRounding + 1.0
                      );
  local_50 = (float)(int)fVar3;
  local_54 = (float)(int)(local_50 * 0.75);
  fVar3 = 0.0;
  local_1d0 = 4.0;
  if (((local_40->IO).ConfigWindowsResizeFromEdges & 1U) == 0) {
    local_1d0 = 0.0;
  }
  local_58 = local_1d0;
  ImVec2::ImVec2(&local_60,3.4028235e+38,3.4028235e+38);
  ImVec2::ImVec2(&local_68,3.4028235e+38,3.4028235e+38);
  (local_10->DC).NavLayerCurrent = ImGuiNavLayer_Menu;
  PushID((char *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  for (local_6c = 0.0; (int)local_6c < (int)local_24; local_6c = (float)((int)local_6c + 1)) {
    local_80._8_8_ = resize_grip_def + (int)local_6c;
    in_stack_fffffffffffffe18 = &local_10->Pos;
    local_88 = operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                         (ImVec2 *)0x13c38e);
    local_80._0_8_ =
         ImLerp(in_stack_fffffffffffffdd8,(ImVec2 *)in_stack_fffffffffffffdd0,
                (ImVec2 *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    local_a8 = operator*((ImVec2 *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),0.0
                        );
    in_stack_fffffffffffffe20 = (ImGuiWindow *)local_80;
    local_a0 = operator-((ImVec2 *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                         (ImVec2 *)0x13c3f7);
    local_b8 = operator*((ImVec2 *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),0.0
                        );
    local_b0 = operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                         (ImVec2 *)0x13c435);
    ImRect::ImRect(&local_98,&local_a0,&local_b0);
    if (local_98.Max.x < local_98.Min.x) {
      ImSwap<float>((float *)&local_98,&local_98.Max.x);
    }
    if (local_98.Max.y < local_98.Min.y) {
      ImSwap<float>(&local_98.Min.y,&local_98.Max.y);
    }
    ImGuiWindow::GetID(in_stack_fffffffffffffdd0,(int)in_stack_fffffffffffffdcc);
    ButtonBehavior((ImRect *)CONCAT44(fVar3,in_stack_fffffffffffffe28),
                   (ImGuiID)((ulong)in_stack_fffffffffffffe20 >> 0x20),
                   (bool *)in_stack_fffffffffffffe18,
                   (bool *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                   (ImGuiButtonFlags)in_stack_fffffffffffffe0c);
    if (((local_b9 & 1) != 0) || ((local_ba & 1) != 0)) {
      IVar2 = 6;
      if (((uint)local_6c & 1) != 0) {
        IVar2 = 5;
      }
      local_40->MouseCursor = IVar2;
    }
    if ((((local_ba & 1) == 0) || (((local_40->IO).MouseDoubleClicked[0] & 1U) == 0)) ||
       (local_6c != 0.0)) {
      if ((local_ba & 1) != 0) {
        local_e0 = operator-((ImVec2 *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8)
                             ,(ImVec2 *)0x13c5d5);
        local_f0 = operator*((ImVec2 *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8)
                             ,0.0);
        local_f8 = operator*((ImVec2 *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8)
                             ,0.0);
        local_e8 = ImLerp(in_stack_fffffffffffffdd8,(ImVec2 *)in_stack_fffffffffffffdd0,
                          (ImVec2 *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
        local_d8 = operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8)
                             ,(ImVec2 *)0x13c66a);
        fVar4 = ((ImVec2 *)local_80._8_8_)->x;
        if ((fVar4 != 1.0) || (NAN(fVar4))) {
          in_stack_fffffffffffffe10 = -3.4028235e+38;
        }
        else {
          in_stack_fffffffffffffe10 = *local_38;
        }
        fVar4 = ((ImVec2 *)local_80._8_8_)->y;
        if ((fVar4 != 1.0) || (NAN(fVar4))) {
          in_stack_fffffffffffffe0c = -3.4028235e+38;
        }
        else {
          in_stack_fffffffffffffe0c = local_38[1];
        }
        in_stack_fffffffffffffe14 = in_stack_fffffffffffffe10;
        ImVec2::ImVec2(&local_100,in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c);
        fVar4 = ((ImVec2 *)local_80._8_8_)->x;
        if ((fVar4 != 0.0) || (NAN(fVar4))) {
          in_stack_fffffffffffffe04 = 3.4028235e+38;
        }
        else {
          in_stack_fffffffffffffe04 = local_38[2];
        }
        fVar4 = ((ImVec2 *)local_80._8_8_)->y;
        if ((fVar4 != 0.0) || (NAN(fVar4))) {
          in_stack_fffffffffffffe00 = 3.4028235e+38;
        }
        else {
          in_stack_fffffffffffffe00 = local_38[3];
        }
        in_stack_fffffffffffffe08 = in_stack_fffffffffffffe04;
        ImVec2::ImVec2(&local_108,in_stack_fffffffffffffe04,in_stack_fffffffffffffe00);
        local_118 = local_108;
        IVar5.y = in_stack_fffffffffffffdec;
        IVar5.x = in_stack_fffffffffffffde8;
        local_110 = ImClamp((ImVec2 *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                            in_stack_fffffffffffffdd8,IVar5);
        local_d8 = local_110;
        CalcResizePosSizeFromAnyCorner
                  ((ImGuiWindow *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                   (ImVec2 *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                   (ImVec2 *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                   (ImVec2 *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                   (ImVec2 *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
      }
    }
    else {
      local_d0 = *local_18;
      new_size.y = fVar3;
      new_size.x = in_stack_fffffffffffffe28;
      local_c4 = CalcWindowSizeAfterConstraint(in_stack_fffffffffffffe20,new_size);
      local_45 = 1;
      local_68 = local_c4;
      ClearActiveID();
    }
    if (((local_6c == 0.0) || ((local_ba & 1) != 0)) || ((local_b9 & 1) != 0)) {
      if ((local_ba & 1) == 0) {
        in_stack_fffffffffffffdfc = 0x1e;
        if ((local_b9 & 1) != 0) {
          in_stack_fffffffffffffdfc = 0x1f;
        }
      }
      else {
        in_stack_fffffffffffffdfc = 0x20;
      }
      IVar1 = GetColorU32((ImGuiCol)in_stack_fffffffffffffde4,in_stack_fffffffffffffde0);
      local_30[(int)local_6c] = IVar1;
    }
  }
  for (local_11c = 0; (int)local_11c < (int)local_4c; local_11c = local_11c + 1) {
    IVar6 = GetResizeBorderRect((ImGuiWindow *)
                                CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                                (int)in_stack_fffffffffffffdec,in_stack_fffffffffffffde8,
                                in_stack_fffffffffffffde4);
    local_130 = IVar6.Min;
    local_128 = IVar6.Max;
    ImGuiWindow::GetID(in_stack_fffffffffffffdd0,(int)in_stack_fffffffffffffdcc);
    ButtonBehavior((ImRect *)CONCAT44(fVar3,in_stack_fffffffffffffe28),
                   (ImGuiID)((ulong)in_stack_fffffffffffffe20 >> 0x20),
                   (bool *)in_stack_fffffffffffffe18,
                   (bool *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                   (ImGuiButtonFlags)in_stack_fffffffffffffe0c);
    if ((((local_11d & 1) != 0) && (0.04 < local_40->HoveredIdTimer)) || ((local_11e & 1) != 0)) {
      IVar2 = 3;
      if ((local_11c & 1) != 0) {
        IVar2 = 4;
      }
      local_40->MouseCursor = IVar2;
      if ((local_11e & 1) != 0) {
        *local_20 = local_11c;
      }
    }
    if ((local_11e & 1) != 0) {
      local_138 = local_10->Pos;
      ImVec2::ImVec2(&local_140);
      if (local_11c == 0) {
        ImVec2::ImVec2(&local_148,0.0,0.0);
        local_140 = local_148;
        local_138.y = ((local_40->IO).MousePos.y - (local_40->ActiveIdClickOffset).y) + 4.0;
      }
      if (local_11c == 1) {
        ImVec2::ImVec2(&local_150,1.0,0.0);
        local_140 = local_150;
        local_138.x = ((local_40->IO).MousePos.x - (local_40->ActiveIdClickOffset).x) + 4.0;
      }
      if (local_11c == 2) {
        ImVec2::ImVec2(&local_158,0.0,1.0);
        local_140 = local_158;
        local_138.y = ((local_40->IO).MousePos.y - (local_40->ActiveIdClickOffset).y) + 4.0;
      }
      if (local_11c == 3) {
        ImVec2::ImVec2(&local_160,0.0,0.0);
        local_140 = local_160;
        local_138.x = ((local_40->IO).MousePos.x - (local_40->ActiveIdClickOffset).x) + 4.0;
      }
      if (local_11c == 1) {
        in_stack_fffffffffffffdf4 = *local_38;
      }
      else {
        in_stack_fffffffffffffdf4 = -3.4028235e+38;
      }
      if (local_11c == 2) {
        in_stack_fffffffffffffdf0 = local_38[1];
      }
      else {
        in_stack_fffffffffffffdf0 = -3.4028235e+38;
      }
      fVar4 = in_stack_fffffffffffffdf4;
      ImVec2::ImVec2(&local_168,in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0);
      if (local_11c == 3) {
        in_stack_fffffffffffffde8 = local_38[2];
      }
      else {
        in_stack_fffffffffffffde8 = 3.4028235e+38;
      }
      if (local_11c == 0) {
        in_stack_fffffffffffffde4 = local_38[3];
      }
      else {
        in_stack_fffffffffffffde4 = 3.4028235e+38;
      }
      in_stack_fffffffffffffdec = in_stack_fffffffffffffde8;
      ImVec2::ImVec2(&local_170,in_stack_fffffffffffffde8,in_stack_fffffffffffffde4);
      local_180 = local_170;
      mx.y = in_stack_fffffffffffffdec;
      mx.x = in_stack_fffffffffffffde8;
      local_178 = ImClamp((ImVec2 *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                          in_stack_fffffffffffffdd8,mx);
      local_138 = local_178;
      CalcResizePosSizeFromAnyCorner
                ((ImGuiWindow *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                 (ImVec2 *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                 (ImVec2 *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                 (ImVec2 *)CONCAT44(in_stack_fffffffffffffdfc,fVar4),
                 (ImVec2 *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
    }
  }
  PopID();
  (local_10->DC).NavLayerCurrent = ImGuiNavLayer_Main;
  if ((local_40->NavWindowingTarget != (ImGuiWindow *)0x0) &&
     (local_40->NavWindowingTarget->RootWindow == local_10)) {
    ImVec2::ImVec2(&local_188);
    if ((local_40->NavInputSource == ImGuiInputSource_NavKeyboard) &&
       (((local_40->IO).KeyShift & 1U) != 0)) {
      local_188 = GetNavInputAmount2d((ImGuiNavDirSourceFlags)in_stack_fffffffffffffe0c,
                                      (ImGuiInputReadMode)in_stack_fffffffffffffe08,
                                      in_stack_fffffffffffffe04,in_stack_fffffffffffffe00);
    }
    if (local_40->NavInputSource == ImGuiInputSource_NavGamepad) {
      local_188 = GetNavInputAmount2d((ImGuiNavDirSourceFlags)in_stack_fffffffffffffe0c,
                                      (ImGuiInputReadMode)in_stack_fffffffffffffe08,
                                      in_stack_fffffffffffffe04,in_stack_fffffffffffffe00);
    }
    if ((local_188.x == 0.0) && (!NAN(local_188.x))) {
      if ((local_188.y == 0.0) && (!NAN(local_188.y))) goto LAB_0013cf76;
    }
    in_stack_fffffffffffffdcc = (local_40->IO).DeltaTime * 600.0;
    fVar4 = ImMin<float>((local_40->IO).DisplayFramebufferScale.x,
                         (local_40->IO).DisplayFramebufferScale.y);
    fVar4 = ImFloor(in_stack_fffffffffffffdcc * fVar4);
    lhs = &local_188;
    operator*=(lhs,fVar4);
    operator-((ImVec2 *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
              (ImVec2 *)0x13ce9e);
    operator-((ImVec2 *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
              (ImVec2 *)0x13cec0);
    local_188 = ImMax(in_stack_fffffffffffffdd8,lhs);
    local_40->NavWindowingToggleLayer = false;
    local_40->NavDisableMouseHover = true;
    IVar1 = GetColorU32((ImGuiCol)in_stack_fffffffffffffde4,in_stack_fffffffffffffde0);
    *local_30 = IVar1;
    operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
              (ImVec2 *)0x13cf4b);
    new_size_00.y = fVar3;
    new_size_00.x = in_stack_fffffffffffffe28;
    local_68 = CalcWindowSizeAfterConstraint(in_stack_fffffffffffffe20,new_size_00);
  }
LAB_0013cf76:
  if ((local_68.x != 3.4028235e+38) || (NAN(local_68.x))) {
    local_10->SizeFull = local_68;
    MarkIniSettingsDirty(local_10);
  }
  if ((local_60.x != 3.4028235e+38) || (NAN(local_60.x))) {
    IVar5 = ImFloor((ImVec2 *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    local_10->Pos = IVar5;
    MarkIniSettingsDirty(local_10);
  }
  local_10->Size = local_10->SizeFull;
  return (bool)(local_45 & 1);
}

Assistant:

static bool ImGui::UpdateWindowManualResize(ImGuiWindow* window, const ImVec2& size_auto_fit, int* border_held, int resize_grip_count, ImU32 resize_grip_col[4], const ImRect& visibility_rect)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindowFlags flags = window->Flags;

    if ((flags & ImGuiWindowFlags_NoResize) || (flags & ImGuiWindowFlags_AlwaysAutoResize) || window->AutoFitFramesX > 0 || window->AutoFitFramesY > 0)
        return false;
    if (window->WasActive == false) // Early out to avoid running this code for e.g. an hidden implicit/fallback Debug window.
        return false;

    bool ret_auto_fit = false;
    const int resize_border_count = g.IO.ConfigWindowsResizeFromEdges ? 4 : 0;
    const float grip_draw_size = IM_FLOOR(ImMax(g.FontSize * 1.35f, window->WindowRounding + 1.0f + g.FontSize * 0.2f));
    const float grip_hover_inner_size = IM_FLOOR(grip_draw_size * 0.75f);
    const float grip_hover_outer_size = g.IO.ConfigWindowsResizeFromEdges ? WINDOWS_RESIZE_FROM_EDGES_HALF_THICKNESS : 0.0f;

    ImVec2 pos_target(FLT_MAX, FLT_MAX);
    ImVec2 size_target(FLT_MAX, FLT_MAX);

    // Resize grips and borders are on layer 1
    window->DC.NavLayerCurrent = ImGuiNavLayer_Menu;

    // Manual resize grips
    PushID("#RESIZE");
    for (int resize_grip_n = 0; resize_grip_n < resize_grip_count; resize_grip_n++)
    {
        const ImGuiResizeGripDef& grip = resize_grip_def[resize_grip_n];
        const ImVec2 corner = ImLerp(window->Pos, window->Pos + window->Size, grip.CornerPosN);

        // Using the FlattenChilds button flag we make the resize button accessible even if we are hovering over a child window
        ImRect resize_rect(corner - grip.InnerDir * grip_hover_outer_size, corner + grip.InnerDir * grip_hover_inner_size);
        if (resize_rect.Min.x > resize_rect.Max.x) ImSwap(resize_rect.Min.x, resize_rect.Max.x);
        if (resize_rect.Min.y > resize_rect.Max.y) ImSwap(resize_rect.Min.y, resize_rect.Max.y);
        bool hovered, held;
        ButtonBehavior(resize_rect, window->GetID(resize_grip_n), &hovered, &held, ImGuiButtonFlags_FlattenChildren | ImGuiButtonFlags_NoNavFocus);
        //GetForegroundDrawList(window)->AddRect(resize_rect.Min, resize_rect.Max, IM_COL32(255, 255, 0, 255));
        if (hovered || held)
            g.MouseCursor = (resize_grip_n & 1) ? ImGuiMouseCursor_ResizeNESW : ImGuiMouseCursor_ResizeNWSE;

        if (held && g.IO.MouseDoubleClicked[0] && resize_grip_n == 0)
        {
            // Manual auto-fit when double-clicking
            size_target = CalcWindowSizeAfterConstraint(window, size_auto_fit);
            ret_auto_fit = true;
            ClearActiveID();
        }
        else if (held)
        {
            // Resize from any of the four corners
            // We don't use an incremental MouseDelta but rather compute an absolute target size based on mouse position
            ImVec2 corner_target = g.IO.MousePos - g.ActiveIdClickOffset + ImLerp(grip.InnerDir * grip_hover_outer_size, grip.InnerDir * -grip_hover_inner_size, grip.CornerPosN); // Corner of the window corresponding to our corner grip
            ImVec2 clamp_min = ImVec2(grip.CornerPosN.x == 1.0f ? visibility_rect.Min.x : -FLT_MAX, grip.CornerPosN.y == 1.0f ? visibility_rect.Min.y : -FLT_MAX);
            ImVec2 clamp_max = ImVec2(grip.CornerPosN.x == 0.0f ? visibility_rect.Max.x : +FLT_MAX, grip.CornerPosN.y == 0.0f ? visibility_rect.Max.y : +FLT_MAX);
            corner_target = ImClamp(corner_target, clamp_min, clamp_max);
            CalcResizePosSizeFromAnyCorner(window, corner_target, grip.CornerPosN, &pos_target, &size_target);
        }
        if (resize_grip_n == 0 || held || hovered)
            resize_grip_col[resize_grip_n] = GetColorU32(held ? ImGuiCol_ResizeGripActive : hovered ? ImGuiCol_ResizeGripHovered : ImGuiCol_ResizeGrip);
    }
    for (int border_n = 0; border_n < resize_border_count; border_n++)
    {
        bool hovered, held;
        ImRect border_rect = GetResizeBorderRect(window, border_n, grip_hover_inner_size, WINDOWS_RESIZE_FROM_EDGES_HALF_THICKNESS);
        ButtonBehavior(border_rect, window->GetID(border_n + 4), &hovered, &held, ImGuiButtonFlags_FlattenChildren);
        //GetForegroundDrawLists(window)->AddRect(border_rect.Min, border_rect.Max, IM_COL32(255, 255, 0, 255));
        if ((hovered && g.HoveredIdTimer > WINDOWS_RESIZE_FROM_EDGES_FEEDBACK_TIMER) || held)
        {
            g.MouseCursor = (border_n & 1) ? ImGuiMouseCursor_ResizeEW : ImGuiMouseCursor_ResizeNS;
            if (held)
                *border_held = border_n;
        }
        if (held)
        {
            ImVec2 border_target = window->Pos;
            ImVec2 border_posn;
            if (border_n == 0) { border_posn = ImVec2(0, 0); border_target.y = (g.IO.MousePos.y - g.ActiveIdClickOffset.y + WINDOWS_RESIZE_FROM_EDGES_HALF_THICKNESS); } // Top
            if (border_n == 1) { border_posn = ImVec2(1, 0); border_target.x = (g.IO.MousePos.x - g.ActiveIdClickOffset.x + WINDOWS_RESIZE_FROM_EDGES_HALF_THICKNESS); } // Right
            if (border_n == 2) { border_posn = ImVec2(0, 1); border_target.y = (g.IO.MousePos.y - g.ActiveIdClickOffset.y + WINDOWS_RESIZE_FROM_EDGES_HALF_THICKNESS); } // Bottom
            if (border_n == 3) { border_posn = ImVec2(0, 0); border_target.x = (g.IO.MousePos.x - g.ActiveIdClickOffset.x + WINDOWS_RESIZE_FROM_EDGES_HALF_THICKNESS); } // Left
            ImVec2 clamp_min = ImVec2(border_n == 1 ? visibility_rect.Min.x : -FLT_MAX, border_n == 2 ? visibility_rect.Min.y : -FLT_MAX);
            ImVec2 clamp_max = ImVec2(border_n == 3 ? visibility_rect.Max.x : +FLT_MAX, border_n == 0 ? visibility_rect.Max.y : +FLT_MAX);
            border_target = ImClamp(border_target, clamp_min, clamp_max);
            CalcResizePosSizeFromAnyCorner(window, border_target, border_posn, &pos_target, &size_target);
        }
    }
    PopID();

    // Restore nav layer
    window->DC.NavLayerCurrent = ImGuiNavLayer_Main;

    // Navigation resize (keyboard/gamepad)
    if (g.NavWindowingTarget && g.NavWindowingTarget->RootWindow == window)
    {
        ImVec2 nav_resize_delta;
        if (g.NavInputSource == ImGuiInputSource_NavKeyboard && g.IO.KeyShift)
            nav_resize_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard, ImGuiInputReadMode_Down);
        if (g.NavInputSource == ImGuiInputSource_NavGamepad)
            nav_resize_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_Down);
        if (nav_resize_delta.x != 0.0f || nav_resize_delta.y != 0.0f)
        {
            const float NAV_RESIZE_SPEED = 600.0f;
            nav_resize_delta *= ImFloor(NAV_RESIZE_SPEED * g.IO.DeltaTime * ImMin(g.IO.DisplayFramebufferScale.x, g.IO.DisplayFramebufferScale.y));
            nav_resize_delta = ImMax(nav_resize_delta, visibility_rect.Min - window->Pos - window->Size);
            g.NavWindowingToggleLayer = false;
            g.NavDisableMouseHover = true;
            resize_grip_col[0] = GetColorU32(ImGuiCol_ResizeGripActive);
            // FIXME-NAV: Should store and accumulate into a separate size buffer to handle sizing constraints properly, right now a constraint will make us stuck.
            size_target = CalcWindowSizeAfterConstraint(window, window->SizeFull + nav_resize_delta);
        }
    }

    // Apply back modified position/size to window
    if (size_target.x != FLT_MAX)
    {
        window->SizeFull = size_target;
        MarkIniSettingsDirty(window);
    }
    if (pos_target.x != FLT_MAX)
    {
        window->Pos = ImFloor(pos_target);
        MarkIniSettingsDirty(window);
    }

    window->Size = window->SizeFull;
    return ret_auto_fit;
}